

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O1

RGBColor __thiscall pm::Matte::globalShade(Matte *this,ShadeRecord *sr)

{
  float fVar1;
  float fVar2;
  long in_RDX;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  RGBColor RVar8;
  Ray reflectedRay;
  undefined1 local_44 [8];
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  
  (this->super_Material)._vptr_Material = (_func_int **)0x0;
  (this->super_Material).type_ = MATTE;
  if (*(int *)(in_RDX + 0x4c) == 0) {
    (**(code **)(*(long *)sr + 0x18))(local_44,sr);
    *(undefined4 *)&(this->super_Material)._vptr_Material = local_44._0_4_;
    *(undefined4 *)((long)&(this->super_Material)._vptr_Material + 4) = local_44._4_4_;
    (this->super_Material).type_ = (Type)local_3c;
  }
  fVar4 = *(float *)(in_RDX + 0x28);
  fVar1 = *(float *)(in_RDX + 0x2c);
  fVar2 = *(float *)(in_RDX + 0x30);
  fVar7 = fVar2 - fVar1 * 0.0071;
  fVar6 = fVar4 * 0.0071 + fVar2 * -0.0034;
  fVar5 = fVar1 * 0.0034 - fVar4;
  fVar3 = fVar5 * fVar5 + fVar7 * fVar7 + fVar6 * fVar6;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar7 = fVar7 / fVar3;
  fVar6 = fVar6 / fVar3;
  fVar5 = fVar5 / fVar3;
  SamplerState::sampleHemisphere((SamplerState *)local_44);
  local_38 = fVar4 * local_3c +
             fVar7 * (float)local_44._4_4_ + (fVar6 * fVar2 - fVar1 * fVar5) * (float)local_44._0_4_
  ;
  local_34 = fVar1 * local_3c +
             fVar6 * (float)local_44._4_4_ + (fVar5 * fVar4 - fVar2 * fVar7) * (float)local_44._0_4_
  ;
  local_30 = fVar2 * local_3c +
             fVar5 * (float)local_44._4_4_ + (fVar7 * fVar1 - fVar4 * fVar6) * (float)local_44._0_4_
  ;
  fVar4 = local_30 * local_30 + local_38 * local_38 + local_34 * local_34;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  local_38 = local_38 / fVar4;
  local_34 = local_34 / fVar4;
  local_30 = local_30 / fVar4;
  fVar5 = *(float *)(in_RDX + 0x28) * local_38;
  fVar6 = (*(float *)(in_RDX + 0x30) * local_30 + *(float *)(in_RDX + 0x2c) * local_34 + fVar5) *
          0.31830987;
  fVar4 = *(float *)&sr->world;
  fVar1 = *(float *)((long)&sr->world + 4);
  fVar2 = *(float *)&sr->tracer;
  fVar3 = *(float *)((long)&sr->tracer + 4);
  fVar5 = *(float *)(in_RDX + 0x30) * local_30 + *(float *)(in_RDX + 0x2c) * local_34 + fVar5;
  local_44._0_4_ = *(undefined4 *)(in_RDX + 0x10);
  local_44._4_4_ = *(undefined4 *)(in_RDX + 0x14);
  local_3c = *(float *)(in_RDX + 0x18);
  (**(code **)(**(long **)(in_RDX + 0x68) + 0x18))
            (&local_2c,*(long **)(in_RDX + 0x68),*(undefined8 *)(in_RDX + 0x60),local_44,
             *(int *)(in_RDX + 0x4c) + 1);
  RVar8.r = (fVar1 * fVar4 * 0.31830987 * local_2c * fVar5) / fVar6 +
            *(float *)&(this->super_Material)._vptr_Material;
  RVar8.g = 0.0;
  *(float *)&(this->super_Material)._vptr_Material = RVar8.r;
  RVar8.b = (fVar2 * fVar4 * 0.31830987 * local_28 * fVar5) / fVar6 +
            *(float *)((long)&(this->super_Material)._vptr_Material + 4);
  *(float *)((long)&(this->super_Material)._vptr_Material + 4) = RVar8.b;
  (this->super_Material).type_ =
       (Type)((fVar4 * fVar3 * 0.31830987 * local_24 * fVar5) / fVar6 +
             (float)(this->super_Material).type_);
  return RVar8;
}

Assistant:

RGBColor Matte::globalShade(ShadeRecord &sr) const
{
	RGBColor L;

	if (sr.depth == 0)
		L = areaLightShade(sr);

	Vector3 wi;
	const Vector3 wo = -sr.ray.d;
	float pdf = 0.0f;
	const RGBColor f = diffuseBrdf_.sampleF(sr, wo, wi, pdf);
	const float nDotWi = dot(sr.normal, wi);
	const Ray reflectedRay(sr.hitPoint, wi);

	L += f * sr.tracer.traceRay(sr.world, reflectedRay, sr.depth + 1) * nDotWi / pdf;

	return L;
}